

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::PsbtRecordData::ConvertFromStruct
          (PsbtRecordData *this,PsbtRecordDataStruct *data)

{
  PsbtRecordDataStruct *data_local;
  PsbtRecordData *this_local;
  
  this->index_ = data->index;
  std::__cxx11::string::operator=((string *)&this->type_,(string *)&data->type);
  std::__cxx11::string::operator=((string *)&this->key_,(string *)&data->key);
  std::__cxx11::string::operator=((string *)&this->value_,(string *)&data->value);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void PsbtRecordData::ConvertFromStruct(
    const PsbtRecordDataStruct& data) {
  index_ = data.index;
  type_ = data.type;
  key_ = data.key;
  value_ = data.value;
  ignore_items = data.ignore_items;
}